

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
insert<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,size_t pos,
          ArrayPtr<const_unsigned_char> *params)

{
  uint uVar1;
  HashBucket *pHVar2;
  size_t sVar3;
  uchar *__s2;
  size_t __n;
  uint uVar4;
  int iVar5;
  long lVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  HashIndex<kj::_::HashSetCallbacks> *this_00;
  ArrayPtr<const_unsigned_char> *in_R9;
  uint uVar9;
  size_t sVar10;
  HashBucket *_s944;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar11;
  Maybe<unsigned_long> MVar12;
  
  this_00 = (HashIndex<kj::_::HashSetCallbacks> *)table.ptr;
  if ((this_00->buckets).size_ * 2 < (this_00->erasedCount + pos) * 3 + 3) {
    rehash(this_00,pos * 3 + 3);
  }
  uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*in_R9);
  pHVar2 = (this_00->buckets).ptr;
  sVar3 = (this_00->buckets).size_;
  __s2 = in_R9->ptr;
  __n = in_R9->size_;
  paVar11 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  uVar9 = (int)sVar3 - 1U & uVar4;
  do {
    paVar7 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pHVar2 + uVar9);
    uVar1 = *(uint *)((long)paVar7 + 4);
    if (uVar1 == 1) {
      if (paVar11 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar11 = paVar7;
      }
    }
    else {
      if (uVar1 == 0) {
        if (paVar11 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          paVar7 = paVar11;
        }
        aVar8.value = ((ulong)uVar4 | (long)params << 0x20) + 0x200000000;
        paVar7->value = (unsigned_long)aVar8;
        *(undefined1 *)this = 0;
        goto LAB_001b4baa;
      }
      if (*(uint *)paVar7 == uVar4) {
        lVar6 = (ulong)(uVar1 - 2) * 0x10;
        if ((*(size_t *)(table.size_ + 8 + lVar6) == __n) &&
           ((__n == 0 || (iVar5 = bcmp(*(void **)(lVar6 + table.size_),__s2,__n), iVar5 == 0)))) {
          aVar8._0_4_ = 0;
          aVar8._4_4_ = 0;
          *(undefined1 *)this = 1;
          this->erasedCount = (ulong)(uVar1 - 2);
LAB_001b4baa:
          MVar12.ptr.field_1.value = aVar8.value;
          MVar12.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar12.ptr;
        }
      }
    }
    sVar10 = (ulong)uVar9 + 1;
    uVar9 = (uint)sVar10;
    if (sVar10 == sVar3) {
      uVar9 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }